

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O3

vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> * __thiscall
callback_data::calc_diff
          (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *__return_storage_ptr__,
          callback_data *this)

{
  pointer *pppgVar1;
  void *pvVar2;
  void *pvVar3;
  iterator __position;
  pointer ppgVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  ggml_tensor *diff_filtered;
  ggml_tensor *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  ppgVar4 = (this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppgVar4) {
    fVar8 = 0.0;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    do {
      uVar7 = (long)(fVar8 - 9.223372e+18) & (long)fVar8 >> 0x3f | (long)fVar8;
      pvVar2 = ppgVar4[uVar7]->data;
      pvVar3 = (this->v_neg).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7]->data;
      local_48 = fVar8;
      lVar5 = ggml_nelements();
      if (lVar5 != 0) {
        lVar6 = 0;
        do {
          *(float *)((long)pvVar2 + lVar6 * 4) =
               *(float *)((long)pvVar2 + lVar6 * 4) - *(float *)((long)pvVar3 + lVar6 * 4);
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
      }
      local_50 = filter_nonzero_rows(this,(this->v_pos).
                                          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar7]);
      __position._M_current =
           (this->v_diff_filtered).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->v_diff_filtered).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::
        _M_realloc_insert<ggml_tensor*const&>
                  ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)&this->v_diff_filtered,
                   __position,&local_50);
      }
      else {
        *__position._M_current = local_50;
        pppgVar1 = &(this->v_diff_filtered).
                    super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppgVar1 = *pppgVar1 + 1;
      }
      fVar8 = local_48 + 1.0;
      ppgVar4 = (this->v_pos).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (fVar8 < (float)(ulong)((long)(this->v_pos).
                                          super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppgVar4
                                   >> 3));
  }
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::vector
            (__return_storage_ptr__,&this->v_diff_filtered);
  return __return_storage_ptr__;
}

Assistant:

std::vector<struct ggml_tensor *> calc_diff() {
        for (float il = 0; il < v_pos.size(); il++) {
            float * a = (float *) v_pos[il]->data;
            float * b = (float *) v_neg[il]->data;
            size_t n_elem = ggml_nelements(v_pos[il]);
            for (size_t j = 0; j < n_elem; j++) {
                a[j] -= b[j];
            }
            //print_debug_tensor(v_pos[i]);
            auto diff_filtered = filter_nonzero_rows(v_pos[il]);
            v_diff_filtered.push_back(diff_filtered);
        }
        return v_diff_filtered; // for convinient, we return the result std::vector
    }